

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

void TerminateHostApis(void)

{
  while (0 < hostApisCount_) {
    hostApisCount_ = hostApisCount_ - 1;
    (*hostApis_[(uint)hostApisCount_]->Terminate)(hostApis_[(uint)hostApisCount_]);
  }
  hostApisCount_ = 0;
  defaultHostApiIndex_ = 0;
  deviceCount_ = 0;
  if (hostApis_ != (PaUtilHostApiRepresentation **)0x0) {
    PaUtil_FreeMemory();
  }
  hostApis_ = (PaUtilHostApiRepresentation **)0x0;
  return;
}

Assistant:

static void TerminateHostApis( void )
{
    /* terminate in reverse order from initialization */
    PA_DEBUG(("TerminateHostApis in \n"));

    while( hostApisCount_ > 0 )
    {
        --hostApisCount_;
        hostApis_[hostApisCount_]->Terminate( hostApis_[hostApisCount_] );
    }
    hostApisCount_ = 0;
    defaultHostApiIndex_ = 0;
    deviceCount_ = 0;

    if( hostApis_ != 0 )
        PaUtil_FreeMemory( hostApis_ );
    hostApis_ = 0;

    PA_DEBUG(("TerminateHostApis out\n"));
}